

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

UChar * ucurr_getPluralName_63
                  (UChar *currency,char *locale,UBool *isChoiceFormat,char *pluralCount,int32_t *len
                  ,UErrorCode *ec)

{
  UBool UVar1;
  int32_t iVar2;
  UResourceBundle *pUVar3;
  UChar *pUVar4;
  UResourceBundle *rb;
  UChar *s;
  char local_e8 [4];
  char buf [4];
  char loc [157];
  UErrorCode ec2;
  UErrorCode *ec_local;
  int32_t *len_local;
  char *pluralCount_local;
  UBool *isChoiceFormat_local;
  char *locale_local;
  UChar *currency_local;
  
  UVar1 = U_FAILURE(*ec);
  if (UVar1 == '\0') {
    stack0xffffffffffffffbc = U_ZERO_ERROR;
    uloc_getName_63(locale,local_e8,0x9d,(UErrorCode *)(loc + 0x9c));
    UVar1 = U_FAILURE(stack0xffffffffffffffbc);
    if ((UVar1 == '\0') && (stack0xffffffffffffffbc != U_STRING_NOT_TERMINATED_WARNING)) {
      myUCharsToChars((char *)((long)&s + 4),currency);
      stack0xffffffffffffffbc = U_ZERO_ERROR;
      pUVar3 = ures_open_63("icudt63l-curr",local_e8,(UErrorCode *)(loc + 0x9c));
      pUVar3 = ures_getByKey_63(pUVar3,"CurrencyPlurals",pUVar3,(UErrorCode *)(loc + 0x9c));
      pUVar3 = ures_getByKeyWithFallback_63
                         (pUVar3,(char *)((long)&s + 4),pUVar3,(UErrorCode *)(loc + 0x9c));
      rb = (UResourceBundle *)
           ures_getStringByKeyWithFallback_63(pUVar3,pluralCount,len,(UErrorCode *)(loc + 0x9c));
      UVar1 = U_FAILURE(stack0xffffffffffffffbc);
      if (UVar1 != '\0') {
        stack0xffffffffffffffbc = U_ZERO_ERROR;
        rb = (UResourceBundle *)
             ures_getStringByKeyWithFallback_63(pUVar3,"other",len,(UErrorCode *)(loc + 0x9c));
        UVar1 = U_FAILURE(stack0xffffffffffffffbc);
        if (UVar1 != '\0') {
          ures_close_63(pUVar3);
          pUVar4 = ucurr_getName_63(currency,locale,UCURR_LONG_NAME,isChoiceFormat,len,ec);
          return pUVar4;
        }
      }
      ures_close_63(pUVar3);
      UVar1 = U_SUCCESS(stack0xffffffffffffffbc);
      if (UVar1 == '\0') {
        iVar2 = u_strlen_63(currency);
        *len = iVar2;
        *ec = U_USING_DEFAULT_WARNING;
        currency_local = currency;
      }
      else {
        if ((stack0xffffffffffffffbc == U_USING_DEFAULT_WARNING) ||
           ((stack0xffffffffffffffbc == U_ERROR_WARNING_START && (*ec != U_USING_DEFAULT_WARNING))))
        {
          *ec = stack0xffffffffffffffbc;
        }
        currency_local = (UChar *)rb;
      }
    }
    else {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
      currency_local = (UChar *)0x0;
    }
  }
  else {
    currency_local = (UChar *)0x0;
  }
  return currency_local;
}

Assistant:

U_CAPI const UChar* U_EXPORT2
ucurr_getPluralName(const UChar* currency,
                    const char* locale,
                    UBool* isChoiceFormat,
                    const char* pluralCount,
                    int32_t* len, // fillin
                    UErrorCode* ec) {
    // Look up the Currencies resource for the given locale.  The
    // Currencies locale data looks like this:
    //|en {
    //|  CurrencyPlurals {
    //|    USD{
    //|      one{"US dollar"}
    //|      other{"US dollars"}
    //|    }
    //|  }
    //|}

    if (U_FAILURE(*ec)) {
        return 0;
    }

    // Use a separate UErrorCode here that does not propagate out of
    // this function.
    UErrorCode ec2 = U_ZERO_ERROR;

    char loc[ULOC_FULLNAME_CAPACITY];
    uloc_getName(locale, loc, sizeof(loc), &ec2);
    if (U_FAILURE(ec2) || ec2 == U_STRING_NOT_TERMINATED_WARNING) {
        *ec = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    char buf[ISO_CURRENCY_CODE_LENGTH+1];
    myUCharsToChars(buf, currency);

    const UChar* s = NULL;
    ec2 = U_ZERO_ERROR;
    UResourceBundle* rb = ures_open(U_ICUDATA_CURR, loc, &ec2);

    rb = ures_getByKey(rb, CURRENCYPLURALS, rb, &ec2);

    // Fetch resource with multi-level resource inheritance fallback
    rb = ures_getByKeyWithFallback(rb, buf, rb, &ec2);

    s = ures_getStringByKeyWithFallback(rb, pluralCount, len, &ec2);
    if (U_FAILURE(ec2)) {
        //  fall back to "other"
        ec2 = U_ZERO_ERROR;
        s = ures_getStringByKeyWithFallback(rb, "other", len, &ec2);     
        if (U_FAILURE(ec2)) {
            ures_close(rb);
            // fall back to long name in Currencies
            return ucurr_getName(currency, locale, UCURR_LONG_NAME, 
                                 isChoiceFormat, len, ec);
        }
    }
    ures_close(rb);

    // If we've succeeded we're done.  Otherwise, try to fallback.
    // If that fails (because we are already at root) then exit.
    if (U_SUCCESS(ec2)) {
        if (ec2 == U_USING_DEFAULT_WARNING
            || (ec2 == U_USING_FALLBACK_WARNING && *ec != U_USING_DEFAULT_WARNING)) {
            *ec = ec2;
        }
        U_ASSERT(s != NULL);
        return s;
    }

    // If we fail to find a match, use the ISO 4217 code
    *len = u_strlen(currency); // Should == ISO_CURRENCY_CODE_LENGTH, but maybe not...?
    *ec = U_USING_DEFAULT_WARNING;
    return currency;
}